

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lackey.cc
# Opt level: O0

void __thiscall gss::innards::Lackey::~Lackey(Lackey *this)

{
  bool bVar1;
  pointer pIVar2;
  ostream *in_stack_ffffffffffffffe0;
  
  pIVar2 = std::
           unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
           operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                       *)0x17cfa8);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)(&pIVar2->send_to + *(long *)(*(long *)&pIVar2->send_to + -0x18)));
  if (bVar1) {
    pIVar2 = std::
             unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
             ::operator->((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
                           *)0x17cfd4);
    in_stack_ffffffffffffffe0 = std::operator<<((ostream *)&pIVar2->send_to,"Q 0");
    std::ostream::operator<<(in_stack_ffffffffffffffe0,std::endl<char,std::char_traits<char>>);
  }
  std::unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>::
  ~unique_ptr((unique_ptr<gss::innards::Lackey::Imp,_std::default_delete<gss::innards::Lackey::Imp>_>
               *)in_stack_ffffffffffffffe0);
  return;
}

Assistant:

Lackey::~Lackey()
{
    if (_imp->send_to) {
        _imp->send_to << "Q 0" << endl;
    }
}